

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall Heap<SAT::VarOrderLt>::insert(Heap<SAT::VarOrderLt> *this,int n)

{
  uint uVar1;
  uint *puVar2;
  uint in_ESI;
  int *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  
  uVar3 = 0xffffffff;
  vec<int>::growTo((vec<int> *)CONCAT44(in_ESI,0xffffffff),(uint)((ulong)in_RDI >> 0x20),
                   (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar1 = vec<int>::size((vec<int> *)(in_RDI + 2));
  puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 6),in_ESI);
  *puVar2 = uVar1;
  vec<int>::push((vec<int> *)CONCAT44(in_ESI,uVar3),in_RDI);
  vec<int>::operator[]((vec<int> *)(in_RDI + 6),in_ESI);
  percolateUp(this,n);
  return;
}

Assistant:

void insert(int n) {
		indices.growTo(n + 1, -1);
		assert(!inHeap(n));

		indices[n] = heap.size();
		heap.push(n);
		percolateUp(indices[n]);
	}